

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rt_rt.hpp
# Opt level: O2

type * viennamath::result_of::
       subtract<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_double,_false,_false>
       ::instance(type *__return_storage_ptr__,
                 rt_expr<viennamath::rt_expression_interface<double>_> *lhs,double *rhs)

{
  int iVar1;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar2;
  rt_expression_interface<double> *prVar3;
  
  iVar1 = (*((lhs->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  poVar2 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar2->_vptr_op_interface = (_func_int **)&PTR__op_interface_00133648;
  prVar3 = traits::clone<viennamath::rt_expression_interface<double>>(*rhs);
  (__return_storage_ptr__->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_001330d8;
  (__return_storage_ptr__->lhs_)._M_ptr =
       (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  (__return_storage_ptr__->op_)._M_ptr = poVar2;
  (__return_storage_ptr__->rhs_)._M_ptr = prVar3;
  return __return_storage_ptr__;
}

Assistant:

static type instance(LHS const & lhs, RHS const & rhs) { return type(traits::clone<iface_type>(lhs), new op_binary<op_minus<numeric_type>, iface_type>(), traits::clone<iface_type>(rhs)); }